

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

unsigned_short
capnp::(anonymous_namespace)::checkRoundTripFromFloat<unsigned_short,double>(double value)

{
  bool bVar1;
  Fault local_f8;
  Fault f_2;
  DebugExpression<double> local_e8;
  undefined1 local_e0 [8];
  DebugComparison<double,_double_&> _kjCondition_2;
  unsigned_short result;
  Fault f_1;
  double *local_a0;
  undefined1 local_98 [8];
  DebugComparison<double_&,_double> _kjCondition_1;
  Fault local_60;
  Fault f;
  double *local_50;
  undefined1 local_48 [8];
  DebugComparison<double_&,_double> _kjCondition;
  unsigned_short MAX;
  double dStack_18;
  unsigned_short MIN;
  double value_local;
  
  _kjCondition._38_2_ = 0;
  _kjCondition._36_2_ = 0xffff;
  dStack_18 = value;
  local_50 = (double *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffffe8);
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<double&>::operator>=
            ((DebugComparison<double_&,_double> *)local_48,(DebugExpression<double&> *)&local_50,
             (double *)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (bVar1) {
    local_a0 = (double *)
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffffe8);
    f_1.exception = (Exception *)0x40efffe000000000;
    kj::_::DebugExpression<double&>::operator<=
              ((DebugComparison<double_&,_double> *)local_98,(DebugExpression<double&> *)&local_a0,
               (double *)&f_1);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
    if (bVar1) {
      _kjCondition_2._38_2_ = SUB42((int)dStack_18,0);
      f_2.exception = (Exception *)(double)((int)dStack_18 & 0xffff);
      local_e8 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(double *)&f_2);
      kj::_::DebugExpression<double>::operator==
                ((DebugComparison<double,_double_&> *)local_e0,&local_e8,&stack0xffffffffffffffe8);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e0);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<double,double&>&,char_const(&)[39],double&>
                  (&local_f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x6df,FAILED,"U(result) == value",
                   "_kjCondition,\"Value out-of-range for requested type.\", value",
                   (DebugComparison<double,_double_&> *)local_e0,
                   (char (*) [39])"Value out-of-range for requested type.",&stack0xffffffffffffffe8)
        ;
        kj::_::Debug::Fault::~Fault(&local_f8);
      }
      value_local._6_2_ = _kjCondition_2._38_2_;
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<double&,double>&,char_const(&)[39],double&>
                ((Fault *)&stack0xffffffffffffff50,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x6db,FAILED,"value <= U(MAX)",
                 "_kjCondition,\"Value out-of-range for requested type.\", value",
                 (DebugComparison<double_&,_double> *)local_98,
                 (char (*) [39])"Value out-of-range for requested type.",&stack0xffffffffffffffe8);
      value_local._6_2_ = 0xffff;
      kj::_::Debug::Fault::~Fault((Fault *)&stack0xffffffffffffff50);
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<double&,double>&,char_const(&)[39],double&>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x6d8,FAILED,"value >= U(MIN)",
               "_kjCondition,\"Value out-of-range for requested type.\", value",
               (DebugComparison<double_&,_double> *)local_48,
               (char (*) [39])"Value out-of-range for requested type.",&stack0xffffffffffffffe8);
    value_local._6_2_ = 0;
    kj::_::Debug::Fault::~Fault(&local_60);
  }
  return value_local._6_2_;
}

Assistant:

T checkRoundTripFromFloat(U value) {
  // When `U` is `float` or `double`, we have to use a different approach, because casting an
  // out-of-range float to an integer is, surprisingly, UB.
  constexpr T MIN = kj::minValue;
  constexpr T MAX = kj::maxValue;
  KJ_REQUIRE(value >= U(MIN), "Value out-of-range for requested type.", value) {
    return MIN;
  }
  KJ_REQUIRE(value <= U(MAX), "Value out-of-range for requested type.", value) {
    return MAX;
  }
  T result = value;
  KJ_REQUIRE(U(result) == value, "Value out-of-range for requested type.", value) {
    // Use it anyway.
    break;
  }
  return result;
}